

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

uint16_t brotli::CombineLengthCodes(uint16_t inscode,uint16_t copycode,bool use_last_distance)

{
  uint16_t bits64;
  bool use_last_distance_local;
  uint16_t copycode_local;
  uint16_t inscode_local;
  
  bits64 = copycode & 7 | (inscode & 7) << 3;
  if (((use_last_distance) && (inscode < 8)) && (copycode < 0x10)) {
    if (7 < copycode) {
      bits64 = bits64 | 0x40;
    }
  }
  else {
    bits64 = CombineLengthCodes::cells[((int)(uint)copycode >> 3) + ((int)(uint)inscode >> 3) * 3] |
             bits64;
  }
  return bits64;
}

Assistant:

static inline uint16_t CombineLengthCodes(
    uint16_t inscode, uint16_t copycode, bool use_last_distance) {
  uint16_t bits64 =
      static_cast<uint16_t>((copycode & 0x7u) | ((inscode & 0x7u) << 3));
  if (use_last_distance && inscode < 8 && copycode < 16) {
    return (copycode < 8) ? bits64 : (bits64 | 64);
  } else {
    // "To convert an insert-and-copy length code to an insert length code and
    // a copy length code, the following table can be used"
    static const uint16_t cells[9] = { 128u, 192u, 384u, 256u, 320u, 512u,
                                       448u, 576u, 640u };
    return cells[(copycode >> 3) + 3 * (inscode >> 3)] | bits64;
  }
}